

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.h
# Opt level: O0

bool __thiscall PropertyDef::stdCppSet(PropertyDef *this)

{
  bool bVar1;
  byte bVar2;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray s;
  undefined7 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffaf;
  QByteArray *rhs;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 local_38 [24];
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  rhs = in_RDI;
  bVar1 = QByteArray::isEmpty((QByteArray *)0x115caa);
  if (bVar1) {
    bVar2 = 0;
  }
  else {
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(&local_20,"set",-1);
    QByteArray::operator[]
              ((QByteArray *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0x115d04)
    ;
    QtMiscUtils::toAsciiUpper('\0');
    QByteArray::operator+=(in_RDI,in_stack_ffffffffffffffaf);
    QByteArray::mid((longlong)local_38,(longlong)in_RDI);
    QByteArray::operator+=
              (in_RDI,(QByteArray *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    QByteArray::~QByteArray((QByteArray *)0x115d4d);
    bVar2 = ::operator==((QByteArray *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0)
                         ,rhs);
    QByteArray::~QByteArray((QByteArray *)0x115d70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool stdCppSet() const {
        if (name.isEmpty())
            return false;
        QByteArray s("set");
        s += QtMiscUtils::toAsciiUpper(name[0]);
        s += name.mid(1);
        return (s == write);
    }